

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lclin.cpp
# Opt level: O2

void __thiscall libDAI::LCLin::LCLin(LCLin *this,FactorGraph *fg,Properties *opts)

{
  _func_int *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer pvVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  VarSet *this_00;
  undefined4 extraout_var_04;
  Var *pVVar6;
  undefined4 extraout_var_05;
  size_type sVar7;
  undefined4 extraout_var_06;
  ulong uVar8;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  Exception *this_01;
  long lVar9;
  size_t i;
  size_t i_1;
  ulong uVar10;
  TFactor<double> local_a8;
  VarSet local_70;
  VarSet local_50;
  
  DAIAlg<libDAI::FactorGraph>::DAIAlg(&this->super_DAIAlgFG,fg,opts);
  (this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_0061f518;
  (this->Props).cavaiopts.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->Props).updates = SEQFIX;
  (this->Props).cavity = FULL;
  *(undefined8 *)&(this->Props).reinit = 0;
  (this->Props).cortol = 0.0;
  (this->Props).tol = 0.0;
  (this->Props).maxiter = 0;
  (this->Props).verbose = 0;
  (this->Props).damping = 0.0;
  (this->Props).cavainame._M_dataplus._M_p = (pointer)0x0;
  (this->Props).cavainame._M_string_length = 0;
  (this->Props).cavainame.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->Props).cavainame.field_2 + 8) = 0;
  *(undefined8 *)
   &(this->Props).cavaiopts.
    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
    ._M_t._M_impl = 0;
  *(undefined8 *)
   &(this->Props).cavaiopts.
    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->Props).cavaiopts.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Props).cavaiopts.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->Props).cavaiopts.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  {unnamed_type#1}::LCLin(&this->Props);
  (this->_phis).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_phis).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_gamma).
  super__Vector_base<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_gamma).
  super__Vector_base<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_gamma).
  super__Vector_base<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_beliefs).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_beliefs).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_beliefs).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_maxdiff = 0.0;
  this->_iterations = 0;
  (this->_phis).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_phis).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_phis).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_gamma).
  super__Vector_base<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_gamma).
  super__Vector_base<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_gamma).
  super__Vector_base<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0x11])(this);
  if ((char)iVar5 != '\0') {
    iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
              (&this->_phis,
               *(long *)(CONCAT44(extraout_var,iVar5) + 0x48) -
               *(long *)(CONCAT44(extraout_var,iVar5) + 0x40) >> 4);
    lVar9 = 0;
    uVar10 = 0;
    while( true ) {
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      p_Var1 = (this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5];
      if ((ulong)(*(long *)(CONCAT44(extraout_var_00,iVar5) + 0x48) -
                  *(long *)(CONCAT44(extraout_var_00,iVar5) + 0x40) >> 4) <= uVar10) break;
      iVar5 = (*p_Var1)(this);
      uVar2 = *(undefined8 *)(*(long *)(CONCAT44(extraout_var_01,iVar5) + 0x40) + lVar9);
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      uVar3 = *(undefined8 *)(*(long *)(CONCAT44(extraout_var_02,iVar5) + 0x40) + 8 + lVar9);
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      this_00 = (VarSet *)
                (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar5) + 0x50))
                          ((long *)CONCAT44(extraout_var_03,iVar5),uVar3);
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      pVVar6 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar5) + 0x30))
                                ((long *)CONCAT44(extraout_var_04,iVar5),uVar2);
      VarSet::VarSet(&local_70,pVVar6);
      VarSet::operator/(&local_50,this_00,&local_70);
      TFactor<double>::TFactor(&local_a8,&local_50);
      std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
      emplace_back<libDAI::TFactor<double>>
                ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
                 &this->_phis,&local_a8);
      TFactor<double>::~TFactor(&local_a8);
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_50);
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_70);
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x10;
    }
    iVar5 = (*p_Var1)(this);
    sVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar5) + 0x28))
                      ((long *)CONCAT44(extraout_var_05,iVar5));
    std::
    vector<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
    ::resize(&this->_gamma,sVar7);
    lVar9 = 0;
    uVar10 = 0;
    while( true ) {
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      uVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar5) + 0x28))
                        ((long *)CONCAT44(extraout_var_06,iVar5));
      if (uVar8 <= uVar10) break;
      pvVar4 = (this->_gamma).
               super__Vector_base<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      TFactor<double>::TFactor(&local_a8);
      std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
      emplace_back<libDAI::TFactor<double>>
                ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
                 ((long)&(pvVar4->
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar9),&local_a8);
      TFactor<double>::~TFactor(&local_a8);
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x18;
    }
    iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    sVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar5) + 0x28))
                      ((long *)CONCAT44(extraout_var_07,iVar5));
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
              (&this->_beliefs,sVar7);
    uVar10 = 0;
    while( true ) {
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      uVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar5) + 0x28))
                        ((long *)CONCAT44(extraout_var_08,iVar5));
      if (uVar8 <= uVar10) break;
      iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      pVVar6 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_09,iVar5) + 0x30))
                                ((long *)CONCAT44(extraout_var_09,iVar5),uVar10);
      TFactor<double>::TFactor(&local_a8,pVVar6);
      std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
      emplace_back<libDAI::TFactor<double>>
                ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
                 &this->_beliefs,&local_a8);
      TFactor<double>::~TFactor(&local_a8);
      uVar10 = uVar10 + 1;
    }
    return;
  }
  this_01 = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"lclin.cpp, line 82",(allocator<char> *)&local_50);
  Exception::Exception(this_01,8,(string *)&local_a8);
  __cxa_throw(this_01,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

LCLin::LCLin(const FactorGraph & fg, const Properties &opts) : DAIAlgFG(fg, opts), Props(), _maxdiff(0.0), _iterations(0UL), _phis(), _gamma(), _beliefs() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        // create phis
        _phis.reserve(grm().nrEdges());
        for( size_t iI = 0; iI < grm().nrEdges(); iI++ ) {
            size_t i = grm().edge(iI).first;
            size_t I = grm().edge(iI).second;
            _phis.push_back( Factor( grm().factor(I).vars() / grm().var(i) ) );
        }

        // Construct _gamma
        _gamma.resize( grm().nrVars() );
        for( size_t i = 0; i < grm().nrVars(); i++ )
            _gamma[i].push_back(Factor());

        // create beliefs
        _beliefs.reserve( grm().nrVars() );
        for( size_t i=0; i < grm().nrVars(); i++ )
            _beliefs.push_back(Factor(grm().var(i)));
    }